

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_qlook.c
# Opt level: O0

void swap_crispen(float *out,size_t w,size_t h)

{
  ulong uVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  double in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  float *in;
  size_t l;
  size_t i;
  undefined8 local_20;
  
  uVar1 = in_RSI * in_RDX;
  lVar2 = g_malloc(uVar1 * 0xc);
  swap_gauss((float *)l,in,unaff_retaddr_00,unaff_retaddr,in_RDI);
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    *(float *)((long)in_RDI + local_20 * 4) =
         (*(float *)(lVar2 + local_20 * 4) - *(float *)((long)in_RDI + local_20 * 4)) * 1.0 +
         *(float *)((long)in_RDI + local_20 * 4);
  }
  swap_gauss((float *)l,in,unaff_retaddr_00,unaff_retaddr,in_RDI);
  swap_gauss((float *)l,in,unaff_retaddr_00,unaff_retaddr,in_RDI);
  swap_gauss((float *)l,in,unaff_retaddr_00,unaff_retaddr,in_RDI);
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    *(float *)((long)in_RDI + local_20 * 4) =
         *(float *)((long)in_RDI + local_20 * 4) +
         ((*(float *)(lVar2 + local_20 * 4) * 1.5 - *(float *)(lVar2 + (local_20 + uVar1) * 4) * 1.0
          ) - *(float *)(lVar2 + (local_20 + uVar1 * 2) * 4) * 0.5);
  }
  g_free(lVar2);
  return;
}

Assistant:

void swap_crispen(float *out, size_t w, size_t h) {
    size_t i, l = w * h;
    float *in = (float *) g_malloc(3 * l * sizeof *in);

    /* apply first a slight blur to reduce pixel scale artifacts */
    swap_gauss(out, in + 0 * l, w, h, .5);
    for (i = 0; i < l; ++i)
        out[i] += BLUR * (in[i + 0 * l] - out[i]);

    swap_gauss(out, in + 0 * l, w, h, SIGMA);
    swap_gauss(out, in + 1 * l, w, h, SIGMA * 1.6);
    swap_gauss(out, in + 2 * l, w, h, SIGMA * 3.2);

    /* DoG narrow & wide */
    for (i = 0; i < l; ++i)
        out[i] += (NARROW + WIDE) * in[i + 0 * l]
            - NARROW * in[i + l] - WIDE * in[i + 2 * l];

    g_free(in);
}